

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_ws.cpp
# Opt level: O1

void duckdb::TemplatedConcatWS
               (DataChunk *args,string_t *sep_data,SelectionVector *sep_sel,SelectionVector *rsel,
               idx_t count,Vector *result)

{
  uint uVar1;
  pointer pVVar2;
  pointer pVVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  data_ptr_t pdVar8;
  string_t *psVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  reference this;
  reference pvVar13;
  InternalException *pIVar14;
  DataChunk *pDVar15;
  idx_t len;
  ulong uVar16;
  idx_t iVar17;
  ulong uVar18;
  UnifiedVectorFormat *pUVar19;
  long lVar20;
  ulong uVar21;
  size_type __n;
  idx_t __n_00;
  data_ptr_t pdVar22;
  data_ptr_t pdVar23;
  long lVar24;
  ulong uVar25;
  data_ptr_t pdVar26;
  string_t sVar27;
  unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat>,_false>
  orrified_data;
  size_type __dnew;
  vector<bool,_true> has_results;
  vector<unsigned_long,_true> result_lengths;
  UnifiedVectorFormat *local_128;
  size_type local_120;
  data_ptr_t local_118;
  ulong local_110;
  ulong local_108;
  UnifiedVectorFormat *local_100;
  void *local_f8;
  undefined4 local_f0;
  long local_e8;
  uint local_e0;
  undefined8 local_d8;
  string local_d0;
  DataChunk *local_b0;
  data_ptr_t local_a8;
  Vector *local_a0;
  SelectionVector *local_98;
  ulong local_90;
  ulong local_88;
  uint local_7c;
  vector<unsigned_long,_true> local_78;
  string_t *local_60;
  data_ptr_t local_58;
  SelectionVector *local_50;
  ulong local_48;
  UnifiedVectorFormat *local_40;
  ulong local_38;
  
  local_f8 = (void *)0x0;
  local_a0 = result;
  local_98 = rsel;
  local_50 = sep_sel;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,args->count,
             (value_type_conflict1 *)&local_f8,(allocator_type *)&local_d0);
  local_d0._M_dataplus._M_p = local_d0._M_dataplus._M_p & 0xffffffffffffff00;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_f8,args->count,(bool *)&local_d0,
             (allocator_type *)&local_120);
  pVVar2 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar20 = (long)pVVar3 - (long)pVVar2 >> 3;
  uVar21 = lVar20 * 0x4ec4ec4ec4ec4ec5;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar21;
  uVar10 = SUB168(auVar6 * ZEXT816(0x48),0);
  uVar11 = uVar10 + 8;
  if (0xfffffffffffffff7 < uVar10) {
    uVar11 = 0xffffffffffffffff;
  }
  uVar10 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0x48),8) == 0) {
    uVar10 = uVar11;
  }
  local_b0 = args;
  local_60 = sep_data;
  puVar12 = (ulong *)operator_new__(uVar10);
  *puVar12 = uVar21;
  local_128 = (UnifiedVectorFormat *)(puVar12 + 1);
  if (pVVar3 != pVVar2) {
    lVar24 = 0;
    pUVar19 = local_128;
    do {
      UnifiedVectorFormat::UnifiedVectorFormat(pUVar19);
      lVar24 = lVar24 + -0x48;
      pUVar19 = pUVar19 + 1;
    } while (-lVar24 != lVar20 * 0x2762762762762768);
  }
  pDVar15 = local_b0;
  if (1 < (ulong)(((long)(local_b0->data).
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(local_b0->data).
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5)) {
    __n = 1;
    lVar20 = 0;
    do {
      this = vector<duckdb::Vector,_true>::operator[](&pDVar15->data,__n);
      Vector::ToUnifiedFormat
                (this,pDVar15->count,(UnifiedVectorFormat *)((long)&local_128->sel + lVar20));
      __n = __n + 1;
      lVar20 = lVar20 + 0x48;
    } while (__n < (ulong)(((long)(pDVar15->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pDVar15->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  if (1 < (ulong)(((long)(pDVar15->data).
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(pDVar15->data).
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5)) {
    local_108 = 1;
    local_88 = 0x800000000000003f;
    do {
      if (count != 0) {
        pUVar19 = local_128 + local_108;
        local_118 = pUVar19[-1].data;
        uVar10 = 0;
        local_100 = pUVar19;
        do {
          uVar11 = uVar10;
          if (local_98->sel_vector != (sel_t *)0x0) {
            uVar11 = (ulong)local_98->sel_vector[uVar10];
          }
          uVar21 = uVar11;
          if (local_50->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)local_50->sel_vector[uVar11];
          }
          psVar4 = (pUVar19[-1].sel)->sel_vector;
          uVar18 = uVar11;
          if (psVar4 != (sel_t *)0x0) {
            uVar18 = (ulong)psVar4[uVar11];
          }
          puVar5 = pUVar19[-1].validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 == (unsigned_long *)0x0) ||
             ((puVar5[uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0)) {
            uVar16 = (ulong)local_e0 + (local_e8 - (long)local_f8) * 8;
            if (uVar16 <= uVar11) {
              pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              local_120 = 0x37;
              local_d0._M_dataplus._M_p =
                   (pointer)::std::__cxx11::string::_M_create((ulong *)&local_d0,(ulong)&local_120);
              local_d0.field_2._M_allocated_capacity = local_120;
              builtin_strncpy(local_d0._M_dataplus._M_p,
                              "Attempted to access index %ld within vector of size %ld",0x37);
              local_d0._M_string_length = local_120;
              local_d0._M_dataplus._M_p[local_120] = '\0';
              InternalException::InternalException<unsigned_long,unsigned_long>
                        (pIVar14,&local_d0,uVar11,uVar16);
              __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            uVar16 = uVar11 + 0x3f;
            if (-1 < (long)uVar11) {
              uVar16 = uVar11;
            }
            uVar25 = (ulong)((uVar11 & local_88) < 0x8000000000000001);
            local_110 = 1L << ((byte)uVar11 & 0x3f);
            if ((*(ulong *)((long)local_f8 + uVar25 * 8 + ((long)uVar16 >> 6) * 8 + -8) >>
                 (uVar11 & 0x3f) & 1) != 0) {
              uVar1 = local_60[uVar21].value.pointer.length;
              pvVar13 = vector<unsigned_long,_true>::operator[](&local_78,uVar11);
              *pvVar13 = *pvVar13 + (ulong)uVar1;
            }
            uVar1 = *(uint *)(local_118 + uVar18 * 0x10);
            pvVar13 = vector<unsigned_long,_true>::operator[](&local_78,uVar11);
            *pvVar13 = *pvVar13 + (ulong)uVar1;
            uVar21 = (ulong)local_e0 + (local_e8 - (long)local_f8) * 8;
            if (uVar21 <= uVar11) {
              pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              local_120 = 0x37;
              local_d0._M_dataplus._M_p =
                   (pointer)::std::__cxx11::string::_M_create((ulong *)&local_d0,(ulong)&local_120);
              local_d0.field_2._M_allocated_capacity = local_120;
              builtin_strncpy(local_d0._M_dataplus._M_p,
                              "Attempted to access index %ld within vector of size %ld",0x37);
              local_d0._M_string_length = local_120;
              local_d0._M_dataplus._M_p[local_120] = '\0';
              InternalException::InternalException<unsigned_long,unsigned_long>
                        (pIVar14,&local_d0,uVar11,uVar21);
              __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            puVar12 = (ulong *)((long)local_f8 + uVar25 * 8 + -8 + ((long)uVar16 >> 6) * 8);
            *puVar12 = *puVar12 | local_110;
            pUVar19 = local_100;
          }
          uVar10 = uVar10 + 1;
        } while (count != uVar10);
      }
      local_108 = local_108 + 1;
    } while (local_108 <
             (ulong)(((long)(local_b0->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_b0->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  local_a8 = local_a0->data;
  if (count != 0) {
    iVar17 = 0;
    do {
      __n_00 = iVar17;
      if (local_98->sel_vector != (sel_t *)0x0) {
        __n_00 = (idx_t)local_98->sel_vector[iVar17];
      }
      pvVar13 = vector<unsigned_long,_true>::operator[](&local_78,__n_00);
      sVar27 = StringVector::EmptyString((StringVector *)local_a0,(Vector *)*pvVar13,len);
      *(long *)(local_a8 + __n_00 * 0x10) = sVar27.value._0_8_;
      *(long *)(local_a8 + __n_00 * 0x10 + 8) = sVar27.value._8_8_;
      pvVar13 = vector<unsigned_long,_true>::operator[](&local_78,__n_00);
      *pvVar13 = 0;
      uVar10 = (ulong)local_e0 + (local_e8 - (long)local_f8) * 8;
      if (uVar10 <= __n_00) {
        pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"Attempted to access index %ld within vector of size %ld","")
        ;
        InternalException::InternalException<unsigned_long,unsigned_long>
                  (pIVar14,&local_d0,__n_00,uVar10);
        __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar10 = __n_00 + 0x3f;
      if (-1 < (long)__n_00) {
        uVar10 = __n_00;
      }
      bVar7 = (byte)__n_00 & 0x3f;
      puVar12 = (ulong *)((long)local_f8 +
                         (ulong)((__n_00 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                         ((long)uVar10 >> 6) * 8 + -8);
      *puVar12 = *puVar12 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      iVar17 = iVar17 + 1;
    } while (count != iVar17);
  }
  if (1 < (ulong)(((long)(local_b0->data).
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(local_b0->data).
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5)) {
    local_90 = 1;
    local_48 = 0x800000000000003f;
    pDVar15 = local_b0;
    do {
      if (count != 0) {
        pUVar19 = local_128 + local_90;
        pdVar22 = pUVar19[-1].data;
        uVar10 = 0;
        local_58 = pdVar22;
        local_40 = pUVar19;
        do {
          psVar9 = local_60;
          pdVar26 = local_a8;
          uVar11 = uVar10;
          if (local_98->sel_vector != (sel_t *)0x0) {
            uVar11 = (ulong)local_98->sel_vector[uVar10];
          }
          uVar21 = uVar11;
          if (local_50->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)local_50->sel_vector[uVar11];
          }
          psVar4 = (pUVar19[-1].sel)->sel_vector;
          uVar18 = uVar11;
          if (psVar4 != (sel_t *)0x0) {
            uVar18 = (ulong)psVar4[uVar11];
          }
          puVar5 = pUVar19[-1].validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 == (unsigned_long *)0x0) ||
             ((puVar5[uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0)) {
            uVar16 = (ulong)local_e0 + (local_e8 - (long)local_f8) * 8;
            if (uVar16 <= uVar11) {
              pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              local_120 = 0x37;
              local_d0._M_dataplus._M_p =
                   (pointer)::std::__cxx11::string::_M_create((ulong *)&local_d0,(ulong)&local_120);
              local_d0.field_2._M_allocated_capacity = local_120;
              builtin_strncpy(local_d0._M_dataplus._M_p,
                              "Attempted to access index %ld within vector of size %ld",0x37);
              local_d0._M_string_length = local_120;
              local_d0._M_dataplus._M_p[local_120] = '\0';
              InternalException::InternalException<unsigned_long,unsigned_long>
                        (pIVar14,&local_d0,uVar11,uVar16);
              __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            local_108 = uVar11 + 0x3f;
            if (-1 < (long)uVar11) {
              local_108 = uVar11;
            }
            local_108 = (long)local_108 >> 6;
            local_a0 = (Vector *)(ulong)((uVar11 & local_48) < 0x8000000000000001);
            local_38 = 1L << ((byte)uVar11 & 0x3f);
            local_110 = uVar11;
            local_88 = uVar10;
            if ((*(ulong *)((long)local_f8 + (long)local_a0 * 8 + local_108 * 8 + -8) >>
                 (uVar11 & 0x3f) & 1) != 0) {
              local_118 = (data_ptr_t)(ulong)local_60[uVar21].value.pointer.length;
              local_100 = (UnifiedVectorFormat *)local_60[uVar21].value.pointer.ptr;
              lVar20 = uVar11 * 0x10;
              local_7c = *(uint *)(local_a8 + lVar20);
              pdVar22 = *(data_ptr_t *)(local_a8 + lVar20 + 8);
              pvVar13 = vector<unsigned_long,_true>::operator[](&local_78,uVar11);
              if (local_7c < 0xd) {
                pdVar22 = pdVar26 + lVar20 + 4;
              }
              pUVar19 = local_100;
              if ((uint)local_118 < 0xd) {
                pUVar19 = (UnifiedVectorFormat *)((long)&psVar9[uVar21].value + 4);
              }
              switchD_015ff80e::default(pdVar22 + *pvVar13,pUVar19,(size_t)local_118);
              pvVar13 = vector<unsigned_long,_true>::operator[](&local_78,local_110);
              *pvVar13 = *pvVar13 + (long)local_118;
              pdVar22 = local_58;
            }
            pdVar8 = local_a8;
            lVar24 = uVar18 * 0x10;
            local_118 = (data_ptr_t)(ulong)*(uint *)(pdVar22 + lVar24);
            pdVar26 = *(data_ptr_t *)(pdVar22 + lVar24 + 8);
            lVar20 = local_110 * 0x10;
            local_100 = (UnifiedVectorFormat *)
                        CONCAT44(local_100._4_4_,*(undefined4 *)(local_a8 + lVar20));
            pdVar23 = *(data_ptr_t *)(local_a8 + lVar20 + 8);
            pvVar13 = vector<unsigned_long,_true>::operator[](&local_78,local_110);
            if ((uint)local_100 < 0xd) {
              pdVar23 = pdVar8 + lVar20 + 4;
            }
            if ((uint)local_118 < 0xd) {
              pdVar26 = pdVar22 + lVar24 + 4;
            }
            switchD_015ff80e::default(pdVar23 + *pvVar13,pdVar26,(size_t)local_118);
            pvVar13 = vector<unsigned_long,_true>::operator[](&local_78,local_110);
            uVar11 = local_110;
            *pvVar13 = (value_type)(local_118 + *pvVar13);
            uVar10 = (ulong)local_e0 + (local_e8 - (long)local_f8) * 8;
            if (uVar10 <= local_110) {
              pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              local_120 = 0x37;
              local_d0._M_dataplus._M_p =
                   (pointer)::std::__cxx11::string::_M_create((ulong *)&local_d0,(ulong)&local_120);
              local_d0.field_2._M_allocated_capacity = local_120;
              builtin_strncpy(local_d0._M_dataplus._M_p,
                              "Attempted to access index %ld within vector of size %ld",0x37);
              local_d0._M_string_length = local_120;
              local_d0._M_dataplus._M_p[local_120] = '\0';
              InternalException::InternalException<unsigned_long,unsigned_long>
                        (pIVar14,&local_d0,uVar11,uVar10);
              __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            puVar12 = (ulong *)((long)local_f8 + (long)local_a0 * 8 + -8 + local_108 * 8);
            *puVar12 = *puVar12 | local_38;
            pUVar19 = local_40;
            uVar10 = local_88;
            pdVar22 = local_58;
          }
          uVar10 = uVar10 + 1;
          pDVar15 = local_b0;
        } while (count != uVar10);
      }
      local_90 = local_90 + 1;
    } while (local_90 <
             (ulong)(((long)(pDVar15->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pDVar15->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  pdVar22 = local_a8;
  if (count != 0) {
    uVar10 = 0;
    do {
      uVar11 = uVar10;
      if (local_98->sel_vector != (sel_t *)0x0) {
        uVar11 = (ulong)local_98->sel_vector[uVar10];
      }
      lVar20 = uVar11 * 0x10;
      uVar11 = (ulong)*(uint *)(pdVar22 + lVar20);
      if (uVar11 < 0xd) {
        switchD_0105b559::default(pdVar22 + uVar11 + lVar20 + 4,0,0xc - uVar11);
      }
      else {
        *(undefined4 *)(pdVar22 + lVar20 + 4) = **(undefined4 **)(pdVar22 + lVar20 + 8);
      }
      uVar10 = uVar10 + 1;
    } while (count != uVar10);
  }
  if (local_128 != (UnifiedVectorFormat *)0x0) {
    ::std::default_delete<duckdb::UnifiedVectorFormat[]>::operator()
              ((default_delete<duckdb::UnifiedVectorFormat[]> *)&local_128,local_128);
  }
  if (local_f8 != (void *)0x0) {
    operator_delete(local_f8);
    local_f8 = (void *)0x0;
    local_f0 = 0;
    local_e8 = 0;
    local_e0 = 0;
    local_d8 = 0;
  }
  if (local_78.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void TemplatedConcatWS(DataChunk &args, const string_t *sep_data, const SelectionVector &sep_sel,
                              const SelectionVector &rsel, idx_t count, Vector &result) {
	vector<idx_t> result_lengths(args.size(), 0);
	vector<bool> has_results(args.size(), false);

	// we overallocate here, but this is important for static analysis
	auto orrified_data = make_unsafe_uniq_array_uninitialized<UnifiedVectorFormat>(args.ColumnCount());

	for (idx_t col_idx = 1; col_idx < args.ColumnCount(); col_idx++) {
		args.data[col_idx].ToUnifiedFormat(args.size(), orrified_data[col_idx - 1]);
	}

	// first figure out the lengths
	for (idx_t col_idx = 1; col_idx < args.ColumnCount(); col_idx++) {
		auto &idata = orrified_data[col_idx - 1];

		auto input_data = UnifiedVectorFormat::GetData<string_t>(idata);
		for (idx_t i = 0; i < count; i++) {
			auto ridx = rsel.get_index(i);
			auto sep_idx = sep_sel.get_index(ridx);
			auto idx = idata.sel->get_index(ridx);
			if (!idata.validity.RowIsValid(idx)) {
				continue;
			}
			if (has_results[ridx]) {
				result_lengths[ridx] += sep_data[sep_idx].GetSize();
			}
			result_lengths[ridx] += input_data[idx].GetSize();
			has_results[ridx] = true;
		}
	}

	// first we allocate the empty strings for each of the values
	auto result_data = FlatVector::GetData<string_t>(result);
	for (idx_t i = 0; i < count; i++) {
		auto ridx = rsel.get_index(i);
		// allocate an empty string of the required size
		result_data[ridx] = StringVector::EmptyString(result, result_lengths[ridx]);
		// we reuse the result_lengths vector to store the currently appended size
		result_lengths[ridx] = 0;
		has_results[ridx] = false;
	}

	// now that the empty space for the strings has been allocated, perform the concatenation
	for (idx_t col_idx = 1; col_idx < args.ColumnCount(); col_idx++) {
		auto &idata = orrified_data[col_idx - 1];
		auto input_data = UnifiedVectorFormat::GetData<string_t>(idata);
		for (idx_t i = 0; i < count; i++) {
			auto ridx = rsel.get_index(i);
			auto sep_idx = sep_sel.get_index(ridx);
			auto idx = idata.sel->get_index(ridx);
			if (!idata.validity.RowIsValid(idx)) {
				continue;
			}
			if (has_results[ridx]) {
				auto sep_size = sep_data[sep_idx].GetSize();
				auto sep_ptr = sep_data[sep_idx].GetData();
				memcpy(result_data[ridx].GetDataWriteable() + result_lengths[ridx], sep_ptr, sep_size);
				result_lengths[ridx] += sep_size;
			}
			auto input_ptr = input_data[idx].GetData();
			auto input_len = input_data[idx].GetSize();
			memcpy(result_data[ridx].GetDataWriteable() + result_lengths[ridx], input_ptr, input_len);
			result_lengths[ridx] += input_len;
			has_results[ridx] = true;
		}
	}
	for (idx_t i = 0; i < count; i++) {
		auto ridx = rsel.get_index(i);
		result_data[ridx].Finalize();
	}
}